

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::RemoveColumn
          (RowGroup *this,RowGroupCollection *new_collection,idx_t removed_column)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  atomic<unsigned_long> aVar2;
  RowGroup *this_01;
  pointer pRVar3;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_02;
  reference __x;
  size_type in_RCX;
  pointer *__ptr;
  size_type __n;
  element_type *local_38;
  __atomic_base<unsigned_long> _Stack_30;
  
  this_01 = (RowGroup *)operator_new(200);
  RowGroup(this_01,(RowGroupCollection *)removed_column,(idx_t)new_collection->block_manager,
           new_collection->row_group_size);
  (this->super_SegmentBase<duckdb::RowGroup>).start = (idx_t)this_01;
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this);
  GetOrCreateVersionInfoPtr((RowGroup *)&stack0xffffffffffffffc8);
  aVar2.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Stack_30._M_i;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_i = 0;
  this_00 = (pRVar3->owned_version_info).internal.
            super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (pRVar3->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (pRVar3->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aVar2.super___atomic_base<unsigned_long>._M_i
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  LOCK();
  (pRVar3->version_info)._M_i.ptr =
       (pRVar3->owned_version_info).internal.
       super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UNLOCK();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_i);
  }
  this_02 = GetColumns((RowGroup *)new_collection);
  if ((this_02->
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ).
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_02->
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ).
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (in_RCX != __n) {
        pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                 operator->((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                             *)this);
        __x = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_02,__n);
        ::std::
        vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        ::push_back(&(pRVar3->columns).
                     super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    ,__x);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_02->
                                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_02->
                                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this);
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroup::RemoveColumn(RowGroupCollection &new_collection, idx_t removed_column) {
	Verify();

	D_ASSERT(removed_column < columns.size());

	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	// copy over all columns except for the removed one
	auto &cols = GetColumns();
	for (idx_t i = 0; i < cols.size(); i++) {
		if (i != removed_column) {
			row_group->columns.push_back(cols[i]);
		}
	}

	row_group->Verify();
	return row_group;
}